

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.hpp
# Opt level: O1

optional_idx __thiscall
duckdb::PartitionedColumnDataAppendState::GetPartitionIndexIfSinglePartition
          (PartitionedColumnDataAppendState *this,bool use_fixed_size_map)

{
  fixed_size_map_iterator<duckdb::list_entry_t,_false> *this_00;
  undefined7 in_register_00000031;
  _Hash_node_base *index;
  iterator result;
  fixed_size_map_iterator<duckdb::list_entry_t,_false> local_28;
  optional_idx local_10;
  
  this_00 = &local_28;
  if ((int)CONCAT71(in_register_00000031,use_fixed_size_map) == 0) {
    if ((this->partition_entries)._M_h._M_element_count != 1) {
      return (optional_idx)0xffffffffffffffff;
    }
    index = (this->partition_entries)._M_h._M_before_begin._M_nxt[1]._M_nxt;
  }
  else {
    if ((this->fixed_partition_entries).count != 1) {
      return (optional_idx)0xffffffffffffffff;
    }
    local_28.map = &this->fixed_partition_entries;
    local_28.entry_idx = 0;
    local_28.idx_in_entry = 0;
    if ((*(this->fixed_partition_entries).occupied.validity_mask & 1) == 0) {
      fixed_size_map_iterator<duckdb::list_entry_t,_false>::operator++(&local_28);
    }
    index = (_Hash_node_base *)(local_28.entry_idx * 8 + local_28.idx_in_entry);
    this_00 = (fixed_size_map_iterator<duckdb::list_entry_t,_false> *)&local_10;
  }
  optional_idx::optional_idx((optional_idx *)this_00,(idx_t)index);
  return (optional_idx)((optional_idx *)this_00)->index;
}

Assistant:

optional_idx GetPartitionIndexIfSinglePartition(const bool use_fixed_size_map) {
		optional_idx result;
		if (use_fixed_size_map) {
			if (fixed_partition_entries.size() == 1) {
				result = fixed_partition_entries.begin().GetKey();
			}
		} else {
			if (partition_entries.size() == 1) {
				result = partition_entries.begin()->first;
			}
		}
		return result;
	}